

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O2

void __thiscall
Analyser_algebraicSystemWithThreeLinkedUnknownsWithOneExternalVariable_Test::TestBody
          (Analyser_algebraicSystemWithThreeLinkedUnknownsWithOneExternalVariable_Test *this)

{
  pointer pbVar1;
  element_type *peVar2;
  long lVar3;
  char *pcVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ScopedTrace gtest_trace_916;
  allocator<char> local_119;
  unsigned_long local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110 [3];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedIssues;
  _Vector_base<libcellml::Issue::ReferenceRule,_std::allocator<libcellml::Issue::ReferenceRule>_>
  local_e0;
  string local_c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  AssertionResult gtest_ar;
  string local_98 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  AnalyserPtr analyser;
  ModelPtr model;
  ParserPtr parser;
  string local_30 [32];
  
  libcellml::Parser::create(SUB81(&parser,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,
             "generator/algebraic_system_with_three_linked_unknowns/model.cellml",
             (allocator<char> *)&expectedIssues);
  fileContents((string *)&gtest_ar);
  libcellml::Parser::parseModel((string *)&model);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&local_118);
  local_118 = 0;
  expectedIssues.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"size_t(0)","parser->issueCount()",&local_118,
             (unsigned_long *)&expectedIssues);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_118);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&expectedIssues,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x382,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&expectedIssues,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expectedIssues);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_118);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,
             "Variable \'z\' in component \'my_algebraic_system\' is computed more than once.",
             (allocator<char> *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,
             "Variable \'y\' in component \'my_algebraic_system\' is computed more than once.",
             (allocator<char> *)&local_e0);
  __l._M_len = 2;
  __l._M_array = (iterator)&gtest_ar;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&expectedIssues,__l,(allocator_type *)&local_78);
  lVar3 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(&gtest_ar.success_ + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  libcellml::Analyser::create();
  peVar2 = analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"my_algebraic_system",(allocator<char> *)&gtest_trace_916);
  libcellml::ComponentEntity::component
            (local_c8,(bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr._0_1_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"x",&local_119);
  libcellml::Component::variable((string *)&local_78);
  libcellml::AnalyserExternalVariable::create((shared_ptr *)&local_e0);
  libcellml::Analyser::addExternalVariable((shared_ptr *)peVar2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_e0._M_impl.super__Vector_impl_data._M_finish);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::~string((string *)&local_118);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  libcellml::Analyser::analyseModel
            ((shared_ptr *)
             analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  testing::ScopedTrace::ScopedTrace
            (&gtest_trace_916,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
             ,0x394,"Issue occurred here.");
  expectedCellmlElementTypes
            ((ulong)&gtest_ar,
             (CellmlElementType)
             ((long)expectedIssues.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)expectedIssues.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  expectedLevels((ulong)&local_118,
                 (Level)((long)expectedIssues.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)expectedIssues.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5));
  expectedReferenceRules
            ((ulong)&local_e0,
             (ReferenceRule)
             ((long)expectedIssues.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)expectedIssues.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  pbVar1 = expectedIssues.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,
             "https://libcellml.org/documentation/guides/latest/runtime_codes/index?issue=ANALYSER_VARIABLE_COMPUTED_MORE_THAN_ONCE"
             ,&local_119);
  expectedUrls(&local_78,
               (long)expectedIssues.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5,local_30);
  std::__shared_ptr<libcellml::Logger,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Analyser,void>
            ((__shared_ptr<libcellml::Logger,(__gnu_cxx::_Lock_policy)2> *)local_c8,
             &analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>);
  expectEqualIssuesCellmlElementTypesLevelsReferenceRulesUrls
            ((vector *)&expectedIssues,(vector *)&gtest_ar,(vector *)&local_118,(vector *)&local_e0,
             (vector *)&local_78,(shared_ptr *)local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  std::__cxx11::string::~string(local_30);
  std::
  _Vector_base<libcellml::Issue::ReferenceRule,_std::allocator<libcellml::Issue::ReferenceRule>_>::
  ~_Vector_base(&local_e0);
  std::_Vector_base<libcellml::Issue::Level,_std::allocator<libcellml::Issue::Level>_>::
  ~_Vector_base((_Vector_base<libcellml::Issue::Level,_std::allocator<libcellml::Issue::Level>_> *)
                &local_118);
  std::_Vector_base<libcellml::CellmlElementType,_std::allocator<libcellml::CellmlElementType>_>::
  ~_Vector_base((_Vector_base<libcellml::CellmlElementType,_std::allocator<libcellml::CellmlElementType>_>
                 *)&gtest_ar);
  local_e0._M_impl.super__Vector_impl_data._M_start._0_4_ = 6;
  libcellml::Analyser::model();
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = libcellml::AnalyserModel::type();
  testing::internal::CmpHelperEQ<libcellml::AnalyserModel::Type,libcellml::AnalyserModel::Type>
            ((internal *)&gtest_ar,"libcellml::AnalyserModel::Type::OVERCONSTRAINED",
             "analyser->model()->type()",(Type *)&local_e0,(Type *)&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_110);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_118);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x396,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_118);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::ScopedTrace::~ScopedTrace(&gtest_trace_916);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&expectedIssues);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Analyser, algebraicSystemWithThreeLinkedUnknownsWithOneExternalVariable)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/algebraic_system_with_three_linked_unknowns/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    const std::vector<std::string> expectedIssues = {
        "Variable 'z' in component 'my_algebraic_system' is computed more than once.",
        "Variable 'y' in component 'my_algebraic_system' is computed more than once.",
    };

    auto analyser = libcellml::Analyser::create();

    analyser->addExternalVariable(libcellml::AnalyserExternalVariable::create(model->component("my_algebraic_system")->variable("x")));

    analyser->analyseModel(model);

    EXPECT_EQ_ISSUES_CELLMLELEMENTTYPES_LEVELS_REFERENCERULES_URLS(expectedIssues,
                                                                   expectedCellmlElementTypes(expectedIssues.size(), libcellml::CellmlElementType::VARIABLE),
                                                                   expectedLevels(expectedIssues.size(), libcellml::Issue::Level::ERROR),
                                                                   expectedReferenceRules(expectedIssues.size(), libcellml::Issue::ReferenceRule::ANALYSER_VARIABLE_COMPUTED_MORE_THAN_ONCE),
                                                                   expectedUrls(expectedIssues.size(), "https://libcellml.org/documentation/guides/latest/runtime_codes/index?issue=ANALYSER_VARIABLE_COMPUTED_MORE_THAN_ONCE"),
                                                                   analyser);

    EXPECT_EQ(libcellml::AnalyserModel::Type::OVERCONSTRAINED, analyser->model()->type());
}